

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O1

void estimate_coeff(FIRSTPASS_STATS *first_stats,FIRSTPASS_STATS *last_stats)

{
  FIRSTPASS_STATS *pFVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  
  for (pFVar1 = first_stats + 1; pFVar1 < last_stats; pFVar1 = pFVar1 + 1) {
    dVar2 = (pFVar1->intra_error - pFVar1->coded_error) * pFVar1[-1].intra_error;
    if (dVar2 <= 0.001) {
      dVar2 = 0.001;
    }
    if (dVar2 < 0.0) {
      dVar2 = sqrt(dVar2);
    }
    else {
      dVar2 = SQRT(dVar2);
    }
    auVar5._0_8_ = pFVar1[-1].intra_error - pFVar1->noise_var;
    auVar5._8_8_ = pFVar1->intra_error - pFVar1->noise_var;
    auVar5 = maxpd(auVar5,_DAT_00504a80);
    dVar3 = auVar5._0_8_ / auVar5._8_8_;
    if (dVar3 < 0.0) {
      dVar3 = sqrt(dVar3);
    }
    else {
      dVar3 = SQRT(dVar3);
    }
    dVar3 = (dVar2 / auVar5._0_8_) * dVar3;
    dVar2 = (double)(~-(ulong)(dVar3 <= 0.0) & ~-(ulong)(dVar3 < 1.0) & 0x3ff0000000000000);
    dVar4 = dVar3;
    if (1.0 <= dVar3) {
      dVar4 = dVar2;
    }
    if (0.0 < dVar3) {
      dVar2 = dVar4;
    }
    pFVar1->cor_coeff = dVar2;
  }
  first_stats->cor_coeff = 1.0;
  return;
}

Assistant:

static void estimate_coeff(FIRSTPASS_STATS *first_stats,
                           FIRSTPASS_STATS *last_stats) {
  FIRSTPASS_STATS *this_stats;
  for (this_stats = first_stats + 1; this_stats < last_stats; this_stats++) {
    const double C =
        sqrt(AOMMAX((this_stats - 1)->intra_error *
                        (this_stats->intra_error - this_stats->coded_error),
                    0.001));
    const double cor_coeff =
        C /
        AOMMAX((this_stats - 1)->intra_error - this_stats->noise_var, 0.001);

    this_stats->cor_coeff =
        cor_coeff *
        sqrt(AOMMAX((this_stats - 1)->intra_error - this_stats->noise_var,
                    0.001) /
             AOMMAX(this_stats->intra_error - this_stats->noise_var, 0.001));
    // clip correlation coefficient.
    this_stats->cor_coeff = AOMMIN(AOMMAX(this_stats->cor_coeff, 0), 1);
  }
  first_stats->cor_coeff = 1.0;
}